

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForTorCorrFunc.cpp
# Opt level: O1

Mat3x3d * __thiscall
OpenMD::ForTorCorrFunc::calcCorrVal
          (Mat3x3d *__return_storage_ptr__,ForTorCorrFunc *this,int frame1,int frame2,int id1,
          int id2)

{
  double dVar1;
  long lVar2;
  long lVar3;
  SquareMatrix3<double> *result;
  long lVar4;
  long lVar5;
  
  result = __return_storage_ptr__;
  lVar2 = *(long *)&(this->forces_).
                    super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[frame1].
                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                    ._M_impl.super__Vector_impl_data;
  lVar3 = *(long *)&(this->torques_).
                    super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[frame2].
                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                    ._M_impl.super__Vector_impl_data;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2]
  [0] = 0.0;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2]
  [1] = 0.0;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1]
  [1] = 0.0;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1]
  [2] = 0.0;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
  [2] = 0.0;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1]
  [0] = 0.0;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
  [0] = 0.0;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
  [1] = 0.0;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2]
  [2] = 0.0;
  lVar4 = 0;
  do {
    dVar1 = *(double *)((long)id1 * 0x18 + lVar2 + lVar4 * 8);
    lVar5 = 0;
    do {
      (((SquareMatrix<double,_3> *)*(double (*) [3])__return_storage_ptr__)->
      super_RectMatrix<double,_3U,_3U>).data_[0][lVar5] =
           *(double *)((long)id2 * 0x18 + lVar3 + lVar5 * 8) * dVar1;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    lVar4 = lVar4 + 1;
    __return_storage_ptr__ = (Mat3x3d *)((long)__return_storage_ptr__ + 0x18);
  } while (lVar4 != 3);
  return result;
}

Assistant:

Mat3x3d ForTorCorrFunc::calcCorrVal(int frame1, int frame2, int id1,
                                      int id2) {
    return outProduct(forces_[frame1][id1], torques_[frame2][id2]);
  }